

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::unrecognizedMoleculeProperty(SelectionEvaluator *this,int param_2)

{
  undefined4 in_ESI;
  string *in_RDI;
  SelectionEvaluator *this_00;
  undefined1 local_31 [17];
  undefined8 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (SelectionEvaluator *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
             (allocator<char> *)in_stack_ffffffffffffffe0);
  evalError(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return;
}

Assistant:

void unrecognizedMoleculeProperty(int) {
      evalError("unrecognized molecule property");
    }